

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O1

void __thiscall
libsbox::BindRule::
BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (BindRule *this,Value *value)

{
  char *pcVar1;
  undefined8 uVar2;
  ContextManager *pCVar3;
  Number NVar4;
  Type pGVar5;
  Ch *pCVar6;
  Data local_58;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->inside_).field_2;
  (this->inside_)._M_dataplus._M_p = (pointer)local_38;
  (this->inside_)._M_string_length = 0;
  (this->inside_).field_2._M_local_buf[0] = '\0';
  (this->outside_)._M_dataplus._M_p = (pointer)&(this->outside_).field_2;
  (this->outside_)._M_string_length = 0;
  (this->outside_).field_2._M_local_buf[0] = '\0';
  if ((value->data_).f.flags != 3) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)value);
  uVar2 = local_58.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(value);
  if (uVar2 == NVar4.i64) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"inside");
  if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"inside");
  pCVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar5);
  pcVar1 = (char *)(this->inside_)._M_string_length;
  strlen(pCVar6);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pCVar6);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)value);
  uVar2 = local_58.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(value);
  if (uVar2 == NVar4.i64) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"outside");
  if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"outside");
  pCVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar5);
  pcVar1 = (char *)(this->outside_)._M_string_length;
  strlen(pCVar6);
  std::__cxx11::string::_M_replace((ulong)&this->outside_,0,pcVar1,(ulong)pCVar6);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)value);
  uVar2 = local_58.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(value);
  if (uVar2 == NVar4.i64) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    local_58.n = (Number)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JSON is incorrect","");
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,&local_58);
    if (local_58.n.i64 != (Number)local_48) {
      operator_delete((void *)local_58.n,local_48[0] + 1);
    }
  }
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000) !=
      (undefined1  [16])0x0) {
    this->flags_ = (pGVar5->data_).s.length;
    return;
  }
  __assert_fail("data_.f.flags & kIntFlag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x719,
                "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

BindRule::BindRule(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(inside_, value, "inside", String);
    GET_MEMBER(outside_, value, "outside", String);
    GET_MEMBER(flags_, value, "flags", Int);
}